

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_273a44::OSScapture::~OSScapture(OSScapture *this)

{
  ~OSScapture(this);
  al_free(this);
  return;
}

Assistant:

OSScapture::~OSScapture()
{
    if(mFd != -1)
        close(mFd);
    mFd = -1;
}